

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

ValidateXrFlagsResult ValidateXrGlobalDimmerFrameEndInfoFlagsML(XrFlags64 value)

{
  ValidateXrFlagsResult VVar1;
  
  VVar1 = VALIDATE_XR_FLAGS_ZERO;
  if (value != 0) {
    VVar1 = (value == 1) + VALIDATE_XR_FLAGS_INVALID;
  }
  return VVar1;
}

Assistant:

ValidateXrFlagsResult ValidateXrGlobalDimmerFrameEndInfoFlagsML(const XrFlags64 value) {
    if (0 == value) {
        return VALIDATE_XR_FLAGS_ZERO;
    }
    XrFlags64 int_value = value;
    if ((int_value & XR_GLOBAL_DIMMER_FRAME_END_INFO_ENABLED_BIT_ML) != 0) {
        // Clear the value XR_GLOBAL_DIMMER_FRAME_END_INFO_ENABLED_BIT_ML since it is valid
        int_value &= ~XR_GLOBAL_DIMMER_FRAME_END_INFO_ENABLED_BIT_ML;
    }
    if (int_value != 0) {
        // Something is left, it must be invalid
        return VALIDATE_XR_FLAGS_INVALID;
    }
    return VALIDATE_XR_FLAGS_SUCCESS;
}